

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug * __thiscall QDebug::operator<<(QDebug *this,char *t)

{
  char *pcVar1;
  QTextStream *this_00;
  storage_type *psVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTextStream *)this->stream;
  if (t == (char *)0x0) {
    psVar3 = (storage_type *)0x0;
  }
  else {
    psVar2 = (storage_type *)0xffffffffffffffff;
    do {
      psVar3 = psVar2 + 1;
      pcVar1 = t + 1 + (long)psVar2;
      psVar2 = psVar3;
    } while (*pcVar1 != '\0');
  }
  QVar4.m_data = psVar3;
  QVar4.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar4);
  QTextStream::operator<<(this_00,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((QTextStream *)this->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)this->stream,' ');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QDebug &operator<<(const char* t) { stream->ts << QString::fromUtf8(t); return maybeSpace(); }